

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

ssize_t ssl_cf_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t blen,_Bool eos,CURLcode *err)

{
  long *plVar1;
  bool bVar2;
  void *pvVar3;
  CURLcode CVar4;
  size_t sVar5;
  ulong uVar6;
  void *pvVar7;
  _Bool done;
  _Bool local_39;
  void *local_38;
  
  plVar1 = (long *)cf->ctx;
  *err = CURLE_OK;
  pvVar7 = (void *)plVar1[9];
  plVar1[9] = (long)data;
  local_38 = buf;
  if ((int)plVar1[0x17] == 1) {
    local_39 = false;
    CVar4 = ssl_cf_connect_deferred(cf,data,buf,blen,&local_39);
    *err = CVar4;
    sVar5 = 0xffffffffffffffff;
    if (CVar4 == CURLE_OK) {
      if (local_39 == false) {
        *err = CURLE_AGAIN;
        goto LAB_001768d0;
      }
      bVar2 = true;
      sVar5 = 0;
    }
    else {
LAB_001768d0:
      bVar2 = false;
    }
    if (!bVar2) goto LAB_00176949;
  }
  else {
    sVar5 = 0;
  }
  uVar6 = plVar1[0x16];
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    if (blen <= uVar6) {
      plVar1[0x16] = uVar6 - blen;
      *err = CURLE_OK;
      sVar5 = blen;
      goto LAB_00176949;
    }
    local_38 = (void *)((long)local_38 + uVar6);
    blen = blen - uVar6;
    plVar1[0x16] = 0;
  }
  if (blen != 0) {
    pvVar3 = local_38;
    local_38 = pvVar7;
    sVar5 = (**(code **)(*plVar1 + 0xb0))(cf,data,pvVar3,blen,err);
    pvVar7 = local_38;
  }
  local_38 = pvVar7;
  if ((long)sVar5 < 0) {
    uVar6 = 0;
  }
  sVar5 = sVar5 + uVar6;
  pvVar7 = local_38;
LAB_00176949:
  *(void **)((long)cf->ctx + 0x48) = pvVar7;
  return sVar5;
}

Assistant:

static ssize_t ssl_cf_send(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           const void *buf, size_t blen,
                           bool eos, CURLcode *err)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct cf_call_data save;
  ssize_t nwritten = 0, early_written = 0;

  (void)eos;
  *err = CURLE_OK;
  CF_DATA_SAVE(save, cf, data);

  if(connssl->state == ssl_connection_deferred) {
    bool done = FALSE;
    *err = ssl_cf_connect_deferred(cf, data, buf, blen, &done);
    if(*err) {
      nwritten = -1;
      goto out;
    }
    else if(!done) {
      *err = CURLE_AGAIN;
      nwritten = -1;
      goto out;
    }
    DEBUGASSERT(connssl->state == ssl_connection_complete);
  }

  if(connssl->earlydata_skip) {
    if(connssl->earlydata_skip >= blen) {
      connssl->earlydata_skip -= blen;
      *err = CURLE_OK;
      nwritten = (ssize_t)blen;
      goto out;
    }
    else {
      early_written = connssl->earlydata_skip;
      buf = ((const char *)buf) + connssl->earlydata_skip;
      blen -= connssl->earlydata_skip;
      connssl->earlydata_skip = 0;
    }
  }

  /* OpenSSL and maybe other TLS libs do not like 0-length writes. Skip. */
  if(blen > 0)
    nwritten = connssl->ssl_impl->send_plain(cf, data, buf, blen, err);

  if(nwritten >= 0)
    nwritten += early_written;

out:
  CF_DATA_RESTORE(cf, save);
  return nwritten;
}